

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void freenode234(node234_conflict *n)

{
  node234_conflict *n_local;
  
  if (n != (node234_conflict *)0x0) {
    freenode234(n->kids[0]);
    freenode234(n->kids[1]);
    freenode234(n->kids[2]);
    freenode234(n->kids[3]);
    safefree(n);
  }
  return;
}

Assistant:

static void freenode234(node234 * n)
{
    if (!n)
        return;
    freenode234(n->kids[0]);
    freenode234(n->kids[1]);
    freenode234(n->kids[2]);
    freenode234(n->kids[3]);
    sfree(n);
}